

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::operator~(SVInt *this)

{
  ulong *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  SVIntStorage *in_RSI;
  ulong uVar6;
  SVInt SVar7;
  
  SVInt(this,in_RSI);
  uVar4 = in_RSI->bitWidth + 0x3f >> 6;
  bVar2 = in_RSI->unknownFlag;
  if (in_RSI->bitWidth < 0x41 && (bVar2 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val = ~(this->super_SVIntStorage).field_0.val;
  }
  else {
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar6;
      *puVar1 = ~*puVar1;
    }
  }
  if ((bVar2 & 1U) != 0) {
    uVar6 = (ulong)(uVar4 << 3);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 8) {
      puVar3 = (this->super_SVIntStorage).field_0.pVal;
      puVar1 = (ulong *)((long)puVar3 + uVar5);
      *puVar1 = *puVar1 & ~*(ulong *)((long)puVar3 + uVar6 + uVar5);
    }
  }
  clearUnusedBits(this);
  SVar7.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator~() const {
    SVInt result(*this);
    uint32_t words = getNumWords(bitWidth, false);

    // just use xor to quickly flip everything
    if (isSingleWord())
        result.val ^= UINT64_MAX;
    else {
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] ^= UINT64_MAX;
    }

    if (unknownFlag) {
        // any unknown bits are still unknown, but we need to make sure
        // any high impedance values become X's
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] &= ~result.pVal[i + words];
    }

    result.clearUnusedBits();
    return result;
}